

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
libcellml::Units::setUnitAttributeReference(Units *this,size_t index,string *reference)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  string *psVar5;
  long lVar6;
  UnitDefinition unitDefinition;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50 [2];
  long local_40 [2];
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[2].mId.field_2._M_allocated_capacity;
  uVar3 = ((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) - sVar2) >> 4) * 0x6db6db6db6db6db7;
  if (index <= uVar3 && uVar3 - index != 0) {
    lVar4 = index * 0x70;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,*(long *)(sVar2 + lVar4),
               *(long *)(sVar2 + 8 + lVar4) + *(long *)(sVar2 + lVar4));
    local_80[0] = local_70;
    lVar6 = *(long *)(sVar2 + 0x20 + lVar4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,lVar6,*(long *)(sVar2 + 0x28 + lVar4) + lVar6);
    lVar6 = sVar2 + lVar4;
    local_60 = *(undefined4 *)(lVar6 + 0x40);
    uStack_5c = *(undefined4 *)(lVar6 + 0x44);
    uStack_58 = *(undefined4 *)(lVar6 + 0x48);
    uStack_54 = *(undefined4 *)(lVar6 + 0x4c);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,*(long *)(lVar6 + 0x50),
               *(long *)(lVar6 + 0x58) + *(long *)(lVar6 + 0x50));
    std::__cxx11::string::_M_assign((string *)local_a0);
    psVar5 = (string *)
             (lVar4 + (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.
                      field_2._M_allocated_capacity);
    std::__cxx11::string::_M_assign(psVar5);
    std::__cxx11::string::_M_assign(psVar5 + 0x20);
    *(ulong *)(psVar5 + 0x40) = CONCAT44(uStack_5c,local_60);
    *(ulong *)(psVar5 + 0x48) = CONCAT44(uStack_54,uStack_58);
    std::__cxx11::string::_M_assign(psVar5 + 0x50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
  }
  return;
}

Assistant:

Units::Units()
    : NamedEntity(new Units::UnitsImpl())
{
    pFunc()->mUnits = this;
}